

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FZFile.cpp
# Opt level: O0

char * FZFile::decompress(char *file_buf,size_t buffer_size,size_t *output_size)

{
  int iVar1;
  uint uVar2;
  char *__dest;
  size_t *in_RDX;
  size_t in_RSI;
  undefined8 in_RDI;
  char *buf;
  int ret;
  z_stream zst;
  char *output;
  undefined8 local_98;
  undefined4 local_90;
  char *local_80;
  int local_78;
  ulong local_70;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_50;
  char *local_28;
  size_t *local_20;
  size_t local_18;
  undefined8 local_10;
  char *local_8;
  
  *in_RDX = in_RSI;
  if (in_RSI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    local_28 = (char *)calloc(*in_RDX,1);
    local_98 = local_10;
    local_90 = (undefined4)local_18;
    local_70 = 0;
    local_58 = 0;
    local_50 = 0;
    iVar1 = inflateInit_(&local_98,"1.2.11",0x70);
    if (iVar1 == 0) {
      do {
        if (*local_20 <= local_70) {
          __dest = (char *)calloc(*local_20 + (local_18 >> 1),1);
          memcpy(__dest,local_28,*local_20);
          *local_20 = (local_18 >> 1) + *local_20;
          free(local_28);
          local_28 = __dest;
        }
        local_80 = local_28 + local_70;
        local_78 = (int)*local_20 - (int)local_70;
        uVar2 = inflate(&local_98,2);
      } while (uVar2 == 0);
      if (uVar2 != 1) {
        printf("Error %d: %s\n",(ulong)uVar2,local_68);
      }
      iVar1 = inflateEnd(&local_98);
      if (iVar1 == 0) {
        local_8 = local_28;
      }
      else {
        free(local_28);
        local_8 = (char *)0x0;
      }
    }
    else {
      free(local_28);
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char *FZFile::decompress(char *file_buf, size_t buffer_size, size_t &output_size) {
	output_size = buffer_size;
	if (buffer_size == 0) return nullptr;

	char *output = (char *)calloc(output_size, sizeof(char));

	z_stream zst;
	zst.next_in   = (Bytef *)file_buf;
	zst.avail_in  = buffer_size;
	zst.total_out = 0;
	zst.zalloc    = Z_NULL;
	zst.zfree     = Z_NULL;

	if (inflateInit(&zst) != Z_OK) {
		free(output);
		return nullptr;
	}

	int ret;
	do {
		// If our output buffer is too small
		if (zst.total_out >= output_size) {
			// Increase size of output buffer
			char *buf = (char *)calloc(output_size + buffer_size / 2, sizeof(char));
			memcpy(buf, output, output_size);
			output_size += buffer_size / 2;
			free(output);
			output = buf;
		}

		zst.next_out  = (Bytef *)(output + zst.total_out);
		zst.avail_out = output_size - zst.total_out;
	} while ((ret = inflate(&zst, Z_SYNC_FLUSH)) == Z_OK);

	if (ret != Z_STREAM_END) printf("Error %d: %s\n", ret, zst.msg);

	if (inflateEnd(&zst) != Z_OK) {
		free(output);
		return nullptr;
	}

	return output;
}